

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

void display_panel(panel *p,_Bool left_adj,region *bounds)

{
  wchar_t x;
  int iVar1;
  int iVar2;
  char *pcVar3;
  panel_line *ppVar4;
  wchar_t x_00;
  int iVar5;
  wchar_t wVar6;
  wchar_t n;
  long lVar8;
  ulong uVar9;
  undefined7 in_register_00000031;
  int iVar10;
  wchar_t y;
  size_t sVar11;
  bool bVar12;
  size_t sVar7;
  
  x = bounds->col;
  iVar1 = bounds->row;
  iVar2 = bounds->width;
  region_erase((region_conflict *)bounds);
  iVar10 = 0;
  if ((int)CONCAT71(in_register_00000031,left_adj) != 0) {
    sVar11 = p->len;
    iVar10 = 0;
    lVar8 = 8;
    while( true ) {
      bVar12 = sVar11 == 0;
      sVar11 = sVar11 - 1;
      if (bVar12) break;
      pcVar3 = *(char **)(p->lines->value + lVar8 + -0x10);
      if (pcVar3 == (char *)0x0) {
        iVar5 = 0;
      }
      else {
        sVar7 = strlen(pcVar3);
        iVar5 = (int)sVar7;
      }
      if (iVar10 <= iVar5) {
        iVar10 = iVar5;
      }
      lVar8 = lVar8 + 0x28;
    }
    iVar10 = iVar10 + 2;
  }
  wVar6 = iVar2 - iVar10;
  lVar8 = 0x10;
  for (uVar9 = 0; uVar9 < p->len; uVar9 = uVar9 + 1) {
    ppVar4 = p->lines;
    pcVar3 = *(char **)(ppVar4->value + lVar8 + -0x18);
    if (pcVar3 != (char *)0x0) {
      y = iVar1 + (int)uVar9;
      sVar7 = strlen(pcVar3);
      Term_putstr(x,y,(wchar_t)sVar7,L'\x01',pcVar3);
      sVar7 = strlen(ppVar4->value + lVar8 + -0x10);
      n = (wchar_t)sVar7;
      if (wVar6 <= (wchar_t)sVar7) {
        n = wVar6 + L'\xffffffff';
      }
      x_00 = (iVar2 + x) - n;
      if (left_adj) {
        x_00 = iVar10 + x;
      }
      Term_putstr(x_00,y,n,(uint)(byte)ppVar4->value[lVar8 + -0x20],ppVar4->value + lVar8 + -0x10);
    }
    lVar8 = lVar8 + 0x28;
  }
  return;
}

Assistant:

static void display_panel(const struct panel *p, bool left_adj,
		const region *bounds)
{
	size_t i;
	int col = bounds->col;
	int row = bounds->row;
	int w = bounds->width;
	int offset = 0;

	region_erase(bounds);

	if (left_adj) {
		for (i = 0; i < p->len; i++) {
			struct panel_line *pl = &p->lines[i];

			int len = pl->label ? strlen(pl->label) : 0;
			if (offset < len) offset = len;
		}
		offset += 2;
	}

	for (i = 0; i < p->len; i++, row++) {
		int len;
		struct panel_line *pl = &p->lines[i];

		if (!pl->label)
			continue;

		Term_putstr(col, row, strlen(pl->label), COLOUR_WHITE, pl->label);

		len = strlen(pl->value);
		len = len < w - offset ? len : w - offset - 1;

		if (left_adj)
			Term_putstr(col+offset, row, len, pl->attr, pl->value);
		else
			Term_putstr(col+w-len, row, len, pl->attr, pl->value);
	}
}